

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
NoArgs<phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>_>
::TestBody(NoArgs<phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  size_t sz;
  long lVar1;
  long lVar2;
  parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX;
  parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_00;
  parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_01;
  parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *s;
  parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_02;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  TypeParam m;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4d0;
  internal local_4c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  AssertHelper local_4b8;
  string local_4b0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_490;
  
  lVar2 = 0x40;
  do {
    *(undefined8 *)((long)&local_4c0 + lVar2) = 0;
    *(undefined8 *)((long)&local_4b8.data_ + lVar2) = 0;
    *(undefined8 *)(local_4c8 + lVar2 + -8) = 0;
    *(undefined8 *)(local_4c8 + lVar2) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar2 + -0x18) = 0;
    *(long *)((long)local_490.sets_._M_elems + lVar2 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_490.sets_._M_elems + lVar2 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar2) = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x4c0);
  lVar1 = 0x10;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + *(long *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar1);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x490);
  local_4c8[0] = (internal)(lVar2 == 0);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  s = (parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
       *)0x4c0;
  if (!(bool)local_4c8[0]) {
    testing::Message::Message((Message *)&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b0,local_4c8,(AssertionResult *)0x214440,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x25,local_4b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    s = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      s = extraout_RDX_00;
    }
    if (local_4d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4d0._M_head_impl + 8))();
      s = extraout_RDX_01;
    }
  }
  if (local_4c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c0,local_4c0);
    s = extraout_RDX_02;
  }
  keys<phmap::parallel_flat_hash_set<std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>,4ul,phmap::NullMutex>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b0,(priv *)&local_490,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_4c8,(char *)&local_4d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"keys(m)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4b0);
  if (local_4c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4b0);
    if (local_4c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_4c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x26,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4d0,(Message *)&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4d0);
    if ((long *)local_4b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4b0._M_dataplus._M_p + 8))();
    }
  }
  if (local_4c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c0,local_4c0);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, NoArgs) {
  TypeParam m;
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAre());
}